

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Estimators.cc
# Opt level: O2

void __thiscall Estimate::KF::CalcEstimate(KF *this,VectorXd *y)

{
  Index IVar1;
  MatrixXd R;
  MatrixXd Z;
  MatrixXd K;
  MatrixXd Pyy;
  MatrixXd Pxy;
  MatrixXd Pbar;
  MatrixXd H;
  DenseStorage<double,__1,__1,__1,_0> local_110;
  void *local_f8 [3];
  void *local_e0 [3];
  void *local_c8 [3];
  void *local_b0 [3];
  DenseStorage<double,__1,__1,__1,_0> local_98;
  DenseStorage<double,__1,__1,__1,_0> local_80;
  CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>,_Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_0>,_const_Eigen::Product<Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>,_Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_0>_>
  local_68;
  
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::DenseStorage
            (&local_80,(DenseStorage<double,__1,__1,__1,_0> *)this);
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::DenseStorage
            (&local_110,(DenseStorage<double,__1,__1,__1,_0> *)&this->R_);
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::DenseStorage
            (&local_98,(DenseStorage<double,__1,__1,__1,_0> *)&this->Pbar_);
  IVar1 = (this->mu_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
          m_rows;
  local_68.m_lhs.m_lhs.m_lhs = (LhsNested)&local_98;
  local_68.m_lhs.m_lhs.m_rhs = (RhsNested)&local_80;
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
  PlainObjectBase<Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>>,0>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)local_b0,
             (DenseBase<Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_0>_>
              *)&local_68);
  local_68.m_rhs.m_lhs.m_lhs = (LhsNested)&local_110;
  local_68.m_lhs.m_lhs.m_lhs = (LhsNested)&local_80;
  local_68.m_lhs.m_lhs.m_rhs = (RhsNested)&local_98;
  local_68.m_lhs.m_rhs.m_matrix = (non_const_type)&local_80;
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
  PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Product<Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,_1,0,_1,_1>,0>,Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>>,0>const,Eigen::Matrix<double,_1,_1,0,_1,_1>const>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)local_c8,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>,_Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_0>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
              *)&local_68);
  local_68.m_lhs.m_lhs.m_lhs = (LhsNested)local_b0;
  local_68.m_lhs.m_lhs.m_rhs = (RhsNested)local_c8;
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
  PlainObjectBase<Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Inverse<Eigen::Matrix<double,_1,_1,0,_1,_1>>,0>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)local_e0,
             (DenseBase<Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Inverse<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_0>_>
              *)&local_68);
  local_68.m_lhs.m_lhs.m_rhs = (RhsNested)(long)(int)IVar1;
  local_68.m_lhs.m_rhs.m_matrix = local_68.m_lhs.m_lhs.m_rhs;
  local_68.m_rhs.m_lhs.m_rhs = (RhsNested)local_e0;
  local_68.m_rhs.m_rhs.m_matrix = (non_const_type)&local_80;
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
  PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>const,Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,_1,0,_1,_1>,0>const>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)local_f8,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_const_Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>_>_>
              *)&local_68);
  local_68.m_rhs.m_lhs.m_rhs = (RhsNested)&local_110;
  local_68.m_lhs.m_lhs.m_lhs = (LhsNested)local_f8;
  local_68.m_lhs.m_lhs.m_rhs = (RhsNested)&local_98;
  local_68.m_lhs.m_rhs.m_matrix = (non_const_type)local_f8;
  local_68.m_rhs.m_lhs.m_lhs = (LhsNested)local_e0;
  local_68.m_rhs.m_rhs.m_matrix = (non_const_type)local_e0;
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Product<Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,_1,0,_1,_1>,0>,Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>>,0>const,Eigen::Product<Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,_1,0,_1,_1>,0>,Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>>,0>const>>
            (&this->Phat_,&local_68);
  local_68.m_lhs.m_lhs.m_lhs = (LhsNested)&this->mu_;
  local_68.m_lhs.m_lhs.m_rhs = (RhsNested)local_e0;
  local_68.m_lhs.m_rhs.m_matrix = (non_const_type)y;
  local_68.m_rhs.m_lhs.m_lhs = (LhsNested)&local_80;
  local_68.m_rhs.m_lhs.m_rhs = local_68.m_lhs.m_lhs.m_lhs;
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,1,0,_1,1>,0>const>,0>const>>
            (&this->xhat_,
             (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>_>,_0>_>
              *)&local_68);
  free(local_f8[0]);
  free(local_e0[0]);
  free(local_c8[0]);
  free(local_b0[0]);
  free(local_98.m_data);
  free(local_110.m_data);
  free(local_80.m_data);
  return;
}

Assistant:

void KF::CalcEstimate(Eigen::VectorXd y){

		//extract locals
		Eigen::MatrixXd H = this->H_;
		Eigen::MatrixXd R = this->R_;
		Eigen::MatrixXd Pbar = this->Pbar_;
		int N_x = this->mu_.size();

		// find kalman gain
		Eigen::MatrixXd Pxy = Pbar*H.transpose();
		Eigen::MatrixXd Pyy = H*Pbar*H.transpose() + R;
		Eigen::MatrixXd K = Pxy*Pyy.inverse();

		//covariance
		Eigen::MatrixXd Z = Eigen::MatrixXd::Identity(N_x,N_x) - K*H;
		this->Phat_ = Z*Pbar*Z.transpose() + K*R*K.transpose();

		//estimate
		this->xhat_ = this->mu_ + K*(y - H*this->mu_);


	}